

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O1

void __thiscall
pybind11::detail::loader_life_support::~loader_life_support(loader_life_support *this)

{
  _Hash_node_base *p_Var1;
  Py_tss_t *pPVar2;
  loader_life_support *plVar3;
  _Hash_node_base *p_Var4;
  
  pPVar2 = get_stack_tls_key();
  plVar3 = (loader_life_support *)PyThread_tss_get(pPVar2);
  if (plVar3 == this) {
    plVar3 = this->parent;
    pPVar2 = get_stack_tls_key();
    PyThread_tss_set(pPVar2,plVar3);
    for (p_Var4 = (this->keep_alive)._M_h._M_before_begin._M_nxt; p_Var4 != (_Hash_node_base *)0x0;
        p_Var4 = p_Var4->_M_nxt) {
      p_Var1 = p_Var4[1]._M_nxt;
      p_Var1->_M_nxt = (_Hash_node_base *)((long)&p_Var1->_M_nxt[-1]._M_nxt + 7);
      if (p_Var1->_M_nxt == (_Hash_node_base *)0x0) {
        _Py_Dealloc();
      }
    }
    std::
    _Hashtable<_object_*,__object_*,_std::allocator<_object_*>,_std::__detail::_Identity,_std::equal_to<_object_*>,_std::hash<_object_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&(this->keep_alive)._M_h);
    return;
  }
  pybind11_fail("loader_life_support: internal error");
}

Assistant:

~loader_life_support() {
        if (get_stack_top() != this) {
            pybind11_fail("loader_life_support: internal error");
        }
        set_stack_top(parent);
        for (auto *item : keep_alive) {
            Py_DECREF(item);
        }
    }